

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cset.c
# Opt level: O0

char * cset_openTag(FILE *out,char *line)

{
  int iVar1;
  csafestring_t *pcVar2;
  csafestring_t *pcVar3;
  char *pcVar4;
  size_t in_RSI;
  FILE *in_RDI;
  csafestring_t *var;
  csafestring_t *value;
  csafestring_t *in_stack_fffffffffffffff8;
  
  pcVar2 = modules_extractVariable((char *)value,(char *)var);
  pcVar3 = modules_extractVariable((char *)value,(char *)var);
  if ((pcVar2 == (csafestring_t *)0x0) || (pcVar3 == (csafestring_t *)0x0)) {
    safe_destroy((csafestring_t *)0x1059e2);
    safe_destroy((csafestring_t *)0x1059eb);
    pcVar4 = modules_findEndOfTag((char *)0x1059f5);
  }
  else {
    iVar1 = safe_strncmp(in_stack_fffffffffffffff8,(char *)in_RDI,in_RSI);
    if (iVar1 == 0) {
      fprintf(in_RDI,"setVariable(__internal_mfunction, __internal_root, \"%s\",",pcVar3->data);
      expression_eval((FILE *)var,(char *)in_stack_fffffffffffffff8,SUB81((ulong)in_RDI >> 0x38,0));
      fprintf(in_RDI,");\n");
    }
    else {
      fprintf(in_RDI,"setVariable(__internal_mfunction, __internal_root, \"%s\", \"%s\");\n",
              pcVar3->data,pcVar2->data);
    }
    safe_destroy((csafestring_t *)0x105a90);
    safe_destroy((csafestring_t *)0x105a99);
    pcVar4 = modules_findEndOfTag((char *)0x105aa3);
  }
  return pcVar4 + 1;
}

Assistant:

static char *cset_openTag(FILE *out, char *line) {
	csafestring_t *value = modules_extractVariable(line, "value");
	csafestring_t *var = modules_extractVariable(line, "var");

	if ( value == NULL || var == NULL ) {
		safe_destroy(value);
		safe_destroy(var);
		return modules_findEndOfTag(line) + 1;
	}

	if ( !safe_strncmp(value, "${", 2) ) {
		fprintf(out, "setVariable(__internal_mfunction, __internal_root, \"%s\",", var->data);
		expression_eval(out, value->data, true);
		fprintf(out, ");\n");
	} else {
		fprintf(out, "setVariable(__internal_mfunction, __internal_root, \"%s\", \"%s\");\n", var->data, value->data);
	}

	safe_destroy(value);
	safe_destroy(var);
	return modules_findEndOfTag(line) + 1;
}